

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O0

void Amap_ManMatchNode(Amap_Man_t *p,Amap_Obj_t *pNode,int fFlow,int fRefs)

{
  float fVar1;
  undefined8 uVar2;
  int iVar3;
  Amap_Nod_t *pAVar4;
  Amap_Cut_t *pAVar5;
  float fVar6;
  float fVar7;
  int local_c4;
  int i;
  Amap_Nod_t *pNod;
  Amap_Set_t *pSet;
  Amap_Cut_t *pCut;
  Amap_Mat_t *pMBest;
  Amap_Mat_t *pMThis;
  Amap_Mat_t *pMBestD;
  Amap_Mat_t *pMBestA;
  Amap_Mat_t M;
  Amap_Mat_t MD;
  Amap_Mat_t MA;
  int fVeryVerbose;
  int fVerbose;
  int fRefs_local;
  int fFlow_local;
  Amap_Obj_t *pNode_local;
  Amap_Man_t *p_local;
  
  memset(&MD.Delay,0,0x20);
  memset(&M.Delay,0,0x20);
  memset(&pMBestA,0,0x20);
  pCut = (Amap_Cut_t *)&M.Delay;
  if (fRefs == 0) {
    pNode->EstRefs = (float)pNode->nRefs;
  }
  else {
    fVar1 = pNode->EstRefs;
    iVar3 = Amap_ObjRefsTotal(pNode);
    pNode->EstRefs = (fVar1 + fVar1 + (float)iVar3) / 3.0;
    iVar3 = Amap_ObjRefsTotal(pNode);
    if (0 < iVar3) {
      Amap_CutAreaDeref(p,&pNode->Best);
    }
  }
  M.Delay = 0.0;
  M._28_4_ = 0;
  MD.Delay = 0.0;
  MD._28_4_ = 0;
  local_c4 = 0;
  pSet = (Amap_Set_t *)(pNode->field_11).pData;
  while (local_c4 < (int)(*(uint *)&pNode->field_0x8 >> 0xc)) {
    if (((ulong)pSet->pNext & 0xffff) != 0) {
      pAVar4 = Amap_LibNod(p->pLib,*(uint *)&pSet->pNext & 0xffff);
      for (pNod = (Amap_Nod_t *)pAVar4->pSets; pNod != (Amap_Nod_t *)0x0;
          pNod = *(Amap_Nod_t **)pNod) {
        Amap_ManMatchStart((Amap_Mat_t *)&pMBestA,(Amap_Cut_t *)pSet,(Amap_Set_t *)pNod);
        if (fFlow == 0) {
          Amap_ManMatchGetExacts(p,pNode,(Amap_Mat_t *)&pMBestA);
        }
        else {
          Amap_ManMatchGetFlows(p,(Amap_Mat_t *)&pMBestA);
        }
        if ((M._24_8_ == 0) ||
           (iVar3 = Amap_CutCompareDelay(p,(Amap_Mat_t *)pCut,(Amap_Mat_t *)&pMBestA), iVar3 == 1))
        {
          M._24_8_ = pMBestA;
          MD.pCut = M.pCut;
          MD.pSet = M.pSet;
          MD.Area = M.Area;
          MD.AveFan = M.AveFan;
        }
        if ((MD._24_8_ == 0) ||
           (iVar3 = Amap_CutCompareArea(p,(Amap_Mat_t *)&MD.Delay,(Amap_Mat_t *)&pMBestA),
           iVar3 == 1)) {
          MD._24_8_ = pMBestA;
          MA.pSet = M.pSet;
          MA.Area = M.Area;
          MA.AveFan = M.AveFan;
        }
      }
    }
    local_c4 = local_c4 + 1;
    pSet = (Amap_Set_t *)Amap_ManCutNext((Amap_Cut_t *)pSet);
  }
  fVar6 = Abc_AbsFloat(MA.pSet._0_4_ - MD.pSet._0_4_);
  fVar6 = fVar6 / MD.pSet._0_4_;
  fVar1 = p->pPars->fADratio;
  fVar7 = Abc_AbsFloat(MA.Area - MD.Area);
  if ((fVar1 * fVar7) / MA.Area <= fVar6) {
    pCut = (Amap_Cut_t *)&MD.Delay;
  }
  *(ulong *)pNode =
       *(ulong *)pNode & 0x7fffffffffffffff |
       (ulong)(**(uint **)pCut >> 0x10 & 1 ^ *(uint *)(*(long *)(pCut + 2) + 8) >> 0x10 & 1) << 0x3f
  ;
  (pNode->Best).pCut = *(Amap_Cut_t **)pCut;
  (pNode->Best).pSet = *(Amap_Set_t **)(pCut + 2);
  uVar2 = *(undefined8 *)(pCut + 4);
  (pNode->Best).Area = (float)(int)uVar2;
  (pNode->Best).AveFan = (float)(int)((ulong)uVar2 >> 0x20);
  *(undefined8 *)&(pNode->Best).Delay = *(undefined8 *)(pCut + 6);
  pAVar5 = Amap_ManDupCut(p,(pNode->Best).pCut);
  (pNode->Best).pCut = pAVar5;
  if ((fRefs != 0) && (iVar3 = Amap_ObjRefsTotal(pNode), 0 < iVar3)) {
    Amap_CutAreaRef(p,&pNode->Best);
  }
  return;
}

Assistant:

void Amap_ManMatchNode( Amap_Man_t * p, Amap_Obj_t * pNode, int fFlow, int fRefs )
{
    int fVerbose = 0; //(pNode->Level == 2 || pNode->Level == 4);
    int fVeryVerbose = fVerbose;

    Amap_Mat_t MA = {0}, MD = {0}, M = {0};
    Amap_Mat_t * pMBestA = &MA, * pMBestD = &MD, * pMThis = &M, * pMBest;
    Amap_Cut_t * pCut;
    Amap_Set_t * pSet;
    Amap_Nod_t * pNod;
    int i;

    if ( fRefs )
        pNode->EstRefs = (float)((2.0 * pNode->EstRefs + Amap_ObjRefsTotal(pNode)) / 3.0);
    else
        pNode->EstRefs = (float)pNode->nRefs;
    if ( fRefs && Amap_ObjRefsTotal(pNode) > 0 )
        Amap_CutAreaDeref( p, &pNode->Best );

    if ( fVerbose )
        printf( "\nNode %d (%d)\n", pNode->Id, pNode->Level );

    pMBestA->pCut = pMBestD->pCut = NULL;
    Amap_NodeForEachCut( pNode, pCut, i )
    {
        if ( pCut->iMat == 0 )
            continue;
        pNod = Amap_LibNod( p->pLib, pCut->iMat );
        Amap_LibNodeForEachSet( pNod, pSet )
        {
            Amap_ManMatchStart( pMThis, pCut, pSet );
            if ( fFlow )
                Amap_ManMatchGetFlows( p, pMThis );
            else
                Amap_ManMatchGetExacts( p, pNode, pMThis );
            if ( pMBestD->pCut == NULL || Amap_CutCompareDelay(p, pMBestD, pMThis) == 1 )
                *pMBestD = *pMThis;
            if ( pMBestA->pCut == NULL || Amap_CutCompareArea(p, pMBestA, pMThis) == 1 )
                *pMBestA = *pMThis;

            if ( fVeryVerbose ) 
            {
                printf( "Cut %2d (%d) :  ", i, pCut->nFans );
                printf( "Gate %10s  ",      Amap_LibGate(p->pLib, pMThis->pSet->iGate)->pName );
                printf( "%s  ",             pMThis->pSet->fInv ? "inv" : "   " );
                printf( "Delay %5.2f  ",    pMThis->Delay );
                printf( "Area %5.2f  ",     pMThis->Area );
                printf( "\n" );
            }
        }
    }

    if ( Abc_AbsFloat(pMBestA->Area - pMBestD->Area) / pMBestD->Area >= p->pPars->fADratio * Abc_AbsFloat(pMBestA->Delay - pMBestD->Delay) / pMBestA->Delay )
        pMBest = pMBestA;
    else
        pMBest = pMBestD;

    if ( fVerbose )
    {
        printf( "BEST MATCHA:  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBestA->pSet->iGate)->pName );
        printf( "%s  ",           pMBestA->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBestA->Delay );
        printf( "Area %5.2f  ",   pMBestA->Area );
        printf( "\n" ); 

        printf( "BEST MATCHD:  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBestD->pSet->iGate)->pName );
        printf( "%s  ",           pMBestD->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBestD->Delay );
        printf( "Area %5.2f  ",   pMBestD->Area );
        printf( "\n" ); 

        printf( "BEST MATCH :  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBest->pSet->iGate)->pName );
        printf( "%s  ",           pMBest->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBest->Delay );
        printf( "Area %5.2f  ",   pMBest->Area );
        printf( "\n" ); 
    }

    pNode->fPolar = pMBest->pCut->fInv ^ pMBest->pSet->fInv;
    pNode->Best = *pMBest;
    pNode->Best.pCut = Amap_ManDupCut( p, pNode->Best.pCut );
    if ( fRefs && Amap_ObjRefsTotal(pNode) > 0 )
        Amap_CutAreaRef( p, &pNode->Best );
}